

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QSize __thiscall QToolBarAreaLayoutLine::minimumSize(QToolBarAreaLayoutLine *this)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  int *piVar4;
  long in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem *item;
  int i;
  int a;
  QSize ms;
  int b;
  QSize result;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffffa0;
  QSize *this_00;
  Orientation o;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_30;
  int local_2c;
  int local_20;
  QSize local_1c;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_14 = 0;
  for (local_30 = 0;
      qVar3 = QList<QToolBarAreaLayoutItem>::size((QList<QToolBarAreaLayoutItem> *)(in_RDI + 0x18)),
      local_30 < qVar3; local_30 = local_30 + 1) {
    QList<QToolBarAreaLayoutItem>::operator[]
              ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar1 = QToolBarAreaLayoutItem::skip
                      ((QToolBarAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      local_1c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_1c = QToolBarAreaLayoutItem::minimumSize(in_stack_ffffffffffffffa0);
      iVar2 = pick((Orientation)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_2c = iVar2 + local_2c;
      local_20 = perp((Orientation)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      piVar4 = qMax<int>(&local_14,&local_20);
      local_14 = *piVar4;
    }
  }
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_10;
  QSize::QSize(this_00);
  o = (Orientation)((ulong)this_00 >> 0x20);
  piVar4 = rpick(o,(QSize *)CONCAT44(local_2c,in_stack_ffffffffffffff98));
  *piVar4 = local_2c;
  iVar2 = local_14;
  piVar4 = rperp(o,(QSize *)CONCAT44(local_2c,in_stack_ffffffffffffff98));
  *piVar4 = iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QToolBarAreaLayoutLine::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        QSize ms = item.minimumSize();
        a += pick(o, ms);
        b = qMax(b, perp(o, ms));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}